

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

int __thiscall booster::aio::reactor::poll(reactor *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  pointer prVar1;
  undefined8 *in_R8;
  int r;
  int error;
  error_code local_38;
  int local_28;
  int local_24;
  undefined8 *local_20;
  uint local_18;
  uint local_14;
  pollfd *local_10;
  reactor *local_8;
  
  local_14 = (uint)__nfds;
  local_24 = 0;
  local_20 = in_R8;
  local_18 = __timeout;
  local_10 = __fds;
  local_8 = this;
  prVar1 = std::
           unique_ptr<booster::aio::reactor_impl,_std::default_delete<booster::aio::reactor_impl>_>
           ::operator->((unique_ptr<booster::aio::reactor_impl,_std::default_delete<booster::aio::reactor_impl>_>
                         *)0x2107dd);
  local_28 = (*prVar1->_vptr_reactor_impl[1])
                       (prVar1,local_10,(ulong)local_14,(ulong)local_18,&local_24);
  if (local_24 != 0) {
    std::error_code::error_code(&local_38,local_24,syscat);
    *local_20 = local_38._0_8_;
    local_20[1] = local_38._M_cat;
  }
  return local_28;
}

Assistant:

int reactor::poll(reactor::event *events,int n,int timeout,system::error_code &e) 
	{
		int error = 0;
		int r=impl_->poll(events,n,timeout,error);
		if(error)
			e=system::error_code(error,syscat);
		return r;
	}